

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError PaAlsaStream_Configure
                  (PaAlsaStream *self,PaStreamParameters *inParams,PaStreamParameters *outParams,
                  double sampleRate,unsigned_long framesPerUserBuffer,double *inputLatency,
                  double *outputLatency,PaUtilHostBufferSizeMode *hostBufferSizeMode)

{
  PaAlsaStreamComponent *self_00;
  snd_pcm_uframes_t *psVar1;
  double dVar2;
  snd_pcm_t *psVar3;
  undefined8 uVar4;
  bool bVar5;
  snd_pcm_uframes_t sVar6;
  double *latency;
  int iVar7;
  size_t sVar8;
  long lVar9;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  char *errorText;
  snd_pcm_hw_params_t *hwParams;
  ulong uVar10;
  PaStreamParameters *pPVar11;
  uint uVar12;
  char *pcVar13;
  PaStreamParameters *params;
  PaStreamParameters *pPVar14;
  PaStreamParameters *params_00;
  PaAlsaStreamComponent *pPVar15;
  ulong uVar16;
  PaStreamParameters *pPVar17;
  bool bVar18;
  double dVar19;
  undefined4 uVar20;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  void *pvStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  PaStreamParameters *local_c8;
  snd_pcm_uframes_t minPlayback;
  snd_pcm_uframes_t maxCapture;
  snd_pcm_uframes_t maxPlayback;
  snd_pcm_uframes_t maxBufferSizeCapture;
  snd_pcm_uframes_t maxBufferSizePlayback;
  double *local_98;
  double local_90;
  uint local_88;
  undefined4 uStack_84;
  snd_pcm_uframes_t minCapture;
  PaStreamParameters *local_78;
  PaStreamParameters *local_70;
  PaStreamParameters *local_68;
  PaStreamParameters *local_60;
  double local_58;
  double realSr;
  int local_44;
  PaStreamParameters *pPStack_40;
  int accurate;
  undefined4 local_34;
  int dir;
  undefined1 auVar21 [16];
  
  pvStack_e0 = (void *)0x10bf5c;
  maxBufferSizePlayback = (snd_pcm_uframes_t)inputLatency;
  local_98 = outputLatency;
  local_78 = inParams;
  local_58 = sampleRate;
  pPStack_40 = (PaStreamParameters *)framesPerUserBuffer;
  sVar8 = snd_pcm_hw_params_sizeof();
  lVar9 = -(sVar8 + 0xf & 0xfffffffffffffff0);
  params = (PaStreamParameters *)((long)&local_d8 + lVar9);
  *(undefined8 *)((long)&pvStack_e0 + lVar9) = 0x10bf7a;
  memset(params,0,sVar8);
  *(undefined8 *)((long)&pvStack_e0 + lVar9) = 0x10bf7f;
  sVar8 = snd_pcm_hw_params_sizeof();
  hwParams = (snd_pcm_hw_params_t *)(sVar8 + 0xf & 0xfffffffffffffff0);
  params_00 = (PaStreamParameters *)((long)params - (long)hwParams);
  params_00[-1].hostApiSpecificStreamInfo = (void *)0x10bf9d;
  memset(params_00,0,sVar8);
  pPVar15 = &self->capture;
  if ((self->capture).pcm != (snd_pcm_t *)0x0) {
    params_00[-1].hostApiSpecificStreamInfo = (void *)0x10bfbd;
    paUtilErr_ = PaAlsaStreamComponent_InitialConfigure
                           (pPVar15,params,(int)&local_58,hwParams,inputLatency);
    if (paUtilErr_ < 0) {
      pcVar13 = 
      "Expression \'PaAlsaStreamComponent_InitialConfigure( &self->capture, inParams, self->primeBuffers, hwParamsCapture, &realSr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2714\n"
      ;
      goto LAB_0010c885;
    }
  }
  self_00 = &self->playback;
  minCapture = (snd_pcm_uframes_t)self_00;
  realSr = (double)pPVar15;
  if ((self->playback).pcm != (snd_pcm_t *)0x0) {
    params_00[-1].hostApiSpecificStreamInfo = (void *)0x10bff0;
    paUtilErr_ = PaAlsaStreamComponent_InitialConfigure
                           (self_00,params_00,(int)&local_58,hwParams,inputLatency);
    if (paUtilErr_ < 0) {
      pcVar13 = 
      "Expression \'PaAlsaStreamComponent_InitialConfigure( &self->playback, outParams, self->primeBuffers, hwParamsPlayback, &realSr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2717\n"
      ;
      goto LAB_0010c885;
    }
  }
  pPVar14 = pPStack_40;
  dVar19 = realSr;
  sVar6 = minCapture;
  local_34 = 0;
  local_44 = 1;
  psVar3 = (self->playback).pcm;
  local_70 = outParams;
  if ((self->capture).pcm != (snd_pcm_t *)0x0) {
    if (psVar3 == (snd_pcm_t *)0x0) {
      dVar2 = local_78->suggestedLatency;
      params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c17a;
      paUtilErr_ = PaAlsaStreamComponent_DetermineFramesPerBuffer
                             ((PaAlsaStreamComponent *)dVar19,pPVar14,(unsigned_long)params,dVar2,
                              (snd_pcm_hw_params_t *)&local_44,(int *)inputLatency);
      if (paUtilErr_ < 0) {
        pcVar13 = 
        "Expression \'PaAlsaStreamComponent_DetermineFramesPerBuffer( &self->capture, inputParameters, framesPerUserBuffer, sampleRate, hwParamsCapture, &accurate)\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2670\n"
        ;
        goto LAB_0010c7d1;
      }
      pPVar14 = (PaStreamParameters *)(self->capture).framesPerPeriod;
      goto LAB_0010c563;
    }
    local_d8 = local_58;
    uStack_d0 = 0;
    local_68 = (PaStreamParameters *)(ulong)(uint)numPeriods_;
    if (pPStack_40 != (PaStreamParameters *)0x0) {
      local_88 = 0;
      local_34 = 0;
      params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c06b;
      iVar7 = snd_pcm_hw_params_get_periods_max(params_00);
      pPVar14 = pPStack_40;
      if (iVar7 < 0) {
        params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c79b;
        PaAlsaStream_Configure_cold_1();
        paUtilErr_ = -9999;
      }
      else {
        uVar12 = (uint)local_68;
        pPVar17 = local_78;
        pPVar11 = params;
        local_68 = params_00;
        dVar19 = (double)minCapture;
        pPVar15 = (PaAlsaStreamComponent *)realSr;
        if (local_88 < uVar12) {
          pPVar17 = local_70;
          pPVar11 = params_00;
          local_68 = params;
          dVar19 = realSr;
          pPVar15 = (PaAlsaStreamComponent *)minCapture;
        }
        dVar2 = pPVar17->suggestedLatency;
        params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c0c3;
        paUtilErr_ = PaAlsaStreamComponent_DetermineFramesPerBuffer
                               (pPVar15,pPVar14,(unsigned_long)pPVar11,dVar2,
                                (snd_pcm_hw_params_t *)&local_44,(int *)inputLatency);
        pPVar14 = local_68;
        if (paUtilErr_ < 0) {
          params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c7b0;
          PaUtil_DebugPrint(
                           "Expression \'PaAlsaStreamComponent_DetermineFramesPerBuffer( first, firstStreamParams, framesPerUserBuffer, sampleRate, firstHwParams, &accurate )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2648\n"
                           );
          outParams = local_70;
        }
        else {
          *(snd_pcm_uframes_t *)((long)dVar19 + 0x40) = pPVar15->framesPerPeriod;
          local_34 = 0;
          uVar4 = *(undefined8 *)((long)dVar19 + 0x38);
          params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c0f4;
          iVar7 = snd_pcm_hw_params_set_period_size_near(uVar4,pPVar14,(long)dVar19 + 0x40);
          if (-1 < iVar7) {
            pPVar14 = (PaStreamParameters *)(self->capture).framesPerPeriod;
            pPVar17 = (PaStreamParameters *)(self->playback).framesPerPeriod;
            if (pPVar14 != pPVar17) {
              if (pPVar14 <= pPVar17) {
                pPVar14 = pPVar17;
              }
LAB_0010c510:
              *hostBufferSizeMode = paUtilBoundedHostBufferSize;
            }
            goto LAB_0010c563;
          }
          params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c7bf;
          PaAlsaStream_Configure_cold_2();
          paUtilErr_ = -9999;
          outParams = local_70;
        }
      }
      goto LAB_0010c7de;
    }
    local_34 = 0;
    params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c1aa;
    iVar7 = snd_pcm_hw_params_get_period_size_min(params,&local_88);
    if (iVar7 < 0) {
      params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c7f8;
      PaAlsaStream_Configure_cold_3();
    }
    else {
      local_34 = 0;
      params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c1cb;
      iVar7 = snd_pcm_hw_params_get_period_size_min(params_00,&local_c8);
      if (iVar7 < 0) {
        params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c801;
        PaAlsaStream_Configure_cold_4();
      }
      else {
        local_34 = 0;
        params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c1ec;
        iVar7 = snd_pcm_hw_params_get_period_size_max(params,&minPlayback);
        if (iVar7 < 0) {
          params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c80a;
          PaAlsaStream_Configure_cold_5();
        }
        else {
          local_34 = 0;
          params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c20d;
          iVar7 = snd_pcm_hw_params_get_period_size_max(params_00,&maxCapture);
          if (iVar7 < 0) {
            params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c813;
            PaAlsaStream_Configure_cold_6();
          }
          else {
            local_60 = (PaStreamParameters *)CONCAT44(uStack_84,local_88);
            if ((PaStreamParameters *)CONCAT44(uStack_84,local_88) < local_c8) {
              local_60 = local_c8;
            }
            if (maxCapture < minPlayback) {
              minPlayback = maxCapture;
            }
            pPStack_40 = (PaStreamParameters *)minPlayback;
            if (minPlayback < local_60) {
              params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c823;
              PaUtil_DebugPrint(
                               "Expression \'minPeriodSize <= maxPeriodSize\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2540\n"
                               );
              paUtilErr_ = -0x2709;
              goto LAB_0010c87e;
            }
            local_90 = outParams->suggestedLatency;
            if (local_78->suggestedLatency <= outParams->suggestedLatency) {
              local_90 = local_78->suggestedLatency;
            }
            params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c273;
            iVar7 = snd_pcm_hw_params_get_buffer_size_max(params,&maxPlayback);
            if (iVar7 < 0) {
              pcVar13 = 
              "Expression \'alsa_snd_pcm_hw_params_get_buffer_size_max( hwParamsCapture, &maxBufferSizeCapture )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2548\n"
              ;
              params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c839;
              PaAlsaStream_Configure_cold_7();
              uVar10 = extraout_RAX;
            }
            else {
              params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c28a;
              iVar7 = snd_pcm_hw_params_get_buffer_size_max(params_00,&maxBufferSizeCapture);
              pPVar14 = local_60;
              if (-1 < iVar7) {
                uVar10 = (ulong)(local_d8 * local_90);
                uVar10 = (long)(local_d8 * local_90 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f
                         | uVar10;
                if (maxPlayback < maxBufferSizeCapture) {
                  maxBufferSizeCapture = maxPlayback;
                }
                uVar16 = maxBufferSizeCapture;
                if (uVar10 <= maxBufferSizeCapture) {
                  uVar16 = uVar10;
                }
                auVar21._8_4_ = (int)((ulong)local_60 >> 0x20);
                auVar21._0_8_ = local_60;
                auVar21._12_4_ = 0x45300000;
                uVar20 = SUB84(local_60,0);
                params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c307;
                iVar7 = ilogb((auVar21._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,uVar20) - 4503599627370496.0));
                lVar9 = ((long)iVar7 + 1) -
                        (ulong)(((ulong)((long)&pPVar14[-1].hostApiSpecificStreamInfo + 7U) &
                                (ulong)pPVar14) == 0);
                auVar22._8_4_ = (int)((ulong)lVar9 >> 0x20);
                auVar22._0_8_ = lVar9;
                auVar22._12_4_ = 0x45300000;
                params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c33e;
                dVar19 = exp2((auVar22._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
                pPVar14 = (PaStreamParameters *)
                          ((long)(dVar19 - 9.223372036854776e+18) & (long)dVar19 >> 0x3f |
                          (long)dVar19);
                if (pPVar14 <= pPStack_40) {
                  do {
                    psVar3 = (self->playback).pcm;
                    params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c377;
                    iVar7 = snd_pcm_hw_params_test_period_size(psVar3,params_00,pPVar14,0);
                    if (-1 < iVar7) {
                      psVar3 = (self->capture).pcm;
                      params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c38f;
                      iVar7 = snd_pcm_hw_params_test_period_size(psVar3,params,pPVar14,0);
                      if (-1 < iVar7) break;
                    }
                    pPVar14 = (PaStreamParameters *)((long)pPVar14 * 2);
                  } while (pPVar14 <= pPStack_40);
                }
                if (local_60 < (PaStreamParameters *)(uVar16 / (ulong)local_68)) {
                  local_60 = (PaStreamParameters *)(uVar16 / (ulong)local_68);
                }
                pPVar17 = local_60;
                if (pPStack_40 <= local_60) {
                  pPVar17 = pPStack_40;
                }
                auVar23._8_4_ = (int)((ulong)pPVar17 >> 0x20);
                auVar23._0_8_ = pPVar17;
                auVar23._12_4_ = 0x45300000;
                params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c3e9;
                iVar7 = ilogb((auVar23._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)pPVar17) - 4503599627370496.0));
                lVar9 = ((long)iVar7 + 1) -
                        (ulong)(((ulong)((long)&pPVar17[-1].hostApiSpecificStreamInfo + 7U) &
                                (ulong)pPVar17) == 0);
                auVar24._8_4_ = (int)((ulong)lVar9 >> 0x20);
                auVar24._0_8_ = lVar9;
                auVar24._12_4_ = 0x45300000;
                local_60 = pPVar17;
                params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c424;
                dVar19 = exp2((auVar24._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
                for (pPVar17 = (PaStreamParameters *)
                               ((long)(dVar19 - 9.223372036854776e+18) & (long)dVar19 >> 0x3f |
                               (long)dVar19); pPVar14 <= pPVar17;
                    pPVar17 = (PaStreamParameters *)((ulong)pPVar17 >> 1)) {
                  psVar3 = (self->capture).pcm;
                  params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c45c;
                  iVar7 = snd_pcm_hw_params_test_period_size(psVar3,params,pPVar17,0);
                  if (-1 < iVar7) {
                    psVar3 = (self->playback).pcm;
                    params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c474;
                    iVar7 = snd_pcm_hw_params_test_period_size(psVar3,params_00,pPVar17,0);
                    if (-1 < iVar7) break;
                  }
                }
                pPVar11 = local_60;
                if (pPVar14 < pPVar17) {
                  pPVar14 = pPVar17;
                }
                if (pPStack_40 < pPVar14) {
                  pPStack_40 = (PaStreamParameters *)&(self->capture).framesPerPeriod;
                  (self->capture).framesPerPeriod = (snd_pcm_uframes_t)local_60;
                  local_34 = 0;
                  psVar3 = (self->capture).pcm;
                  params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c4c0;
                  iVar7 = snd_pcm_hw_params_set_period_size_near(psVar3,params);
                  if (iVar7 < 0) {
                    params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c89e;
                    PaAlsaStream_Configure_cold_11();
                  }
                  else {
                    psVar1 = &(self->playback).framesPerPeriod;
                    (self->playback).framesPerPeriod = (snd_pcm_uframes_t)pPVar11;
                    local_34 = 0;
                    psVar3 = (self->playback).pcm;
                    params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c4f2;
                    iVar7 = snd_pcm_hw_params_set_period_size_near(psVar3,params_00,psVar1);
                    if (-1 < iVar7) {
                      pPVar14 = (PaStreamParameters *)*psVar1;
                      if (pPVar14 < *(PaStreamParameters **)pPStack_40) {
                        pPVar14 = *(PaStreamParameters **)pPStack_40;
                      }
                      goto LAB_0010c510;
                    }
                    params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c8b0;
                    PaAlsaStream_Configure_cold_12();
                  }
                }
                else {
                  psVar3 = (self->capture).pcm;
                  params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c52d;
                  iVar7 = snd_pcm_hw_params_set_period_size(psVar3,params,pPVar14,0);
                  if (iVar7 < 0) {
                    params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c8a7;
                    PaAlsaStream_Configure_cold_9();
                  }
                  else {
                    psVar3 = (self->playback).pcm;
                    params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c549;
                    iVar7 = snd_pcm_hw_params_set_period_size(psVar3,params_00,pPVar14,0);
                    if (-1 < iVar7) {
                      (self->playback).framesPerPeriod = (snd_pcm_uframes_t)pPVar14;
                      (self->capture).framesPerPeriod = (snd_pcm_uframes_t)pPVar14;
                      goto LAB_0010c563;
                    }
                    params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c8b9;
                    PaAlsaStream_Configure_cold_10();
                  }
                }
                goto LAB_0010c873;
              }
              pcVar13 = 
              "Expression \'alsa_snd_pcm_hw_params_get_buffer_size_max( hwParamsPlayback, &maxBufferSizePlayback )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2549\n"
              ;
              params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c84a;
              PaAlsaStream_Configure_cold_8();
              uVar10 = extraout_RAX_00;
            }
            if ((uVar10 & 1) == 0) {
              params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c859;
              errorText = (char *)snd_strerror(iVar7);
              params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c869;
              PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar7,errorText);
            }
            params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c873;
            PaUtil_DebugPrint(pcVar13);
          }
        }
      }
    }
LAB_0010c873:
    paUtilErr_ = -9999;
LAB_0010c87e:
    pcVar13 = 
    "Expression \'PaAlsaStream_DetermineFramesPerBuffer( self, realSr, inParams, outParams, framesPerUserBuffer, hwParamsCapture, hwParamsPlayback, hostBufferSizeMode )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2720\n"
    ;
LAB_0010c885:
    params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c88c;
    PaUtil_DebugPrint(pcVar13);
    return paUtilErr_;
  }
  if (psVar3 == (snd_pcm_t *)0x0) {
    params_00[-1].hostApiSpecificStreamInfo = PaAlsaStream_Terminate;
    __assert_fail("self->playback.pcm",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0xa73,
                  "PaError PaAlsaStream_DetermineFramesPerBuffer(PaAlsaStream *, double, const PaStreamParameters *, const PaStreamParameters *, unsigned long, snd_pcm_hw_params_t *, snd_pcm_hw_params_t *, PaUtilHostBufferSizeMode *)"
                 );
  }
  dVar19 = outParams->suggestedLatency;
  params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c143;
  paUtilErr_ = PaAlsaStreamComponent_DetermineFramesPerBuffer
                         ((PaAlsaStreamComponent *)sVar6,pPVar14,(unsigned_long)params_00,dVar19,
                          (snd_pcm_hw_params_t *)&local_44,(int *)inputLatency);
  if (paUtilErr_ < 0) {
    pcVar13 = 
    "Expression \'PaAlsaStreamComponent_DetermineFramesPerBuffer( &self->playback, outputParameters, framesPerUserBuffer, sampleRate, hwParamsPlayback, &accurate )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2677\n"
    ;
LAB_0010c7d1:
    params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c7d8;
    PaUtil_DebugPrint(pcVar13);
LAB_0010c7de:
    if (paUtilErr_ < 0) goto LAB_0010c87e;
  }
  else {
    pPVar14 = (PaStreamParameters *)(self->playback).framesPerPeriod;
LAB_0010c563:
    if (pPVar14 == (PaStreamParameters *)0x0) {
      params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c75d;
      PaUtil_DebugPrint(
                       "Expression \'framesPerHostBuffer != 0\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2682\n"
                       );
      paUtilErr_ = -0x2702;
      goto LAB_0010c87e;
    }
    self->maxFramesPerHostBuffer = (unsigned_long)pPVar14;
    if (((self->playback).canMmap == 0 || local_44 == 0) &&
       (*hostBufferSizeMode = paUtilBoundedHostBufferSize, local_44 == 0)) {
      self->maxFramesPerHostBuffer = (unsigned_long)((long)&pPVar14->device + 1);
    }
    paUtilErr_ = 0;
    outParams = local_70;
  }
  dVar2 = realSr;
  dVar19 = local_58;
  pPVar14 = local_78;
  sVar6 = maxBufferSizePlayback;
  if ((self->capture).pcm != (snd_pcm_t *)0x0) {
    if ((self->capture).framesPerPeriod == 0) {
      params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c8f9;
      __assert_fail("self->capture.framesPerPeriod != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0xaa4,
                    "PaError PaAlsaStream_Configure(PaAlsaStream *, const PaStreamParameters *, const PaStreamParameters *, double, unsigned long, double *, double *, PaUtilHostBufferSizeMode *)"
                   );
    }
    iVar7 = self->primeBuffers;
    params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c5e6;
    paUtilErr_ = PaAlsaStreamComponent_FinishConfigure
                           ((PaAlsaStreamComponent *)dVar2,(snd_pcm_hw_params_t *)params,pPVar14,
                            iVar7,dVar19,(PaTime *)sVar6);
    if (paUtilErr_ < 0) {
      pcVar13 = 
      "Expression \'PaAlsaStreamComponent_FinishConfigure( &self->capture, hwParamsCapture, inParams, self->primeBuffers, realSr, inputLatency )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2726\n"
      ;
      goto LAB_0010c885;
    }
  }
  dVar19 = local_58;
  sVar6 = minCapture;
  latency = local_98;
  if ((self->playback).pcm != (snd_pcm_t *)0x0) {
    if ((self->playback).framesPerPeriod == 0) {
      params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c918;
      __assert_fail("self->playback.framesPerPeriod != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0xaab,
                    "PaError PaAlsaStream_Configure(PaAlsaStream *, const PaStreamParameters *, const PaStreamParameters *, double, unsigned long, double *, double *, PaUtilHostBufferSizeMode *)"
                   );
    }
    iVar7 = self->primeBuffers;
    realSr = local_58;
    params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c632;
    paUtilErr_ = PaAlsaStreamComponent_FinishConfigure
                           ((PaAlsaStreamComponent *)sVar6,(snd_pcm_hw_params_t *)params_00,
                            outParams,iVar7,dVar19,latency);
    dVar19 = realSr;
    if (paUtilErr_ < 0) {
      pcVar13 = 
      "Expression \'PaAlsaStreamComponent_FinishConfigure( &self->playback, hwParamsPlayback, outParams, self->primeBuffers, realSr, outputLatency )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2733\n"
      ;
      goto LAB_0010c885;
    }
  }
  (self->streamRepresentation).streamInfo.sampleRate = dVar19;
  if (self->callbackMode == 0) {
LAB_0010c68b:
    if ((self->capture).pcm == (snd_pcm_t *)0x0) {
LAB_0010c6a0:
      uVar10 = 0xffffffffffffffff;
      bVar5 = true;
      goto LAB_0010c6a9;
    }
  }
  else {
    if ((self->capture).pcm == (snd_pcm_t *)0x0) goto LAB_0010c6a0;
    if ((self->playback).pcm != (snd_pcm_t *)0x0) {
      params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c67d;
      iVar7 = snd_pcm_link();
      if (iVar7 == 0) {
        self->pcmsSynced = 1;
      }
      goto LAB_0010c68b;
    }
  }
  uVar10 = (self->capture).framesPerPeriod;
  bVar5 = false;
LAB_0010c6a9:
  if ((self->playback).pcm == (snd_pcm_t *)0x0) {
    bVar18 = uVar10 == 0xffffffffffffffff;
    uVar10 = 0xffffffffffffffff;
  }
  else {
    uVar16 = (self->playback).framesPerPeriod;
    bVar18 = uVar16 <= uVar10;
    uVar10 = 0xffffffffffffffff;
    if (bVar18) {
      uVar10 = uVar16;
    }
  }
  if (!bVar5 && !bVar18) {
    uVar10 = (self->capture).framesPerPeriod;
  }
  dVar19 = (self->streamRepresentation).streamInfo.sampleRate;
  if (0.0 < dVar19) {
    lVar9 = uVar10 * 1000;
    auVar25._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar25._0_8_ = lVar9;
    auVar25._12_4_ = 0x45300000;
    params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c720;
    dVar19 = ceil(((auVar25._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) / dVar19);
    self->pollTimeout = (int)dVar19;
    return 0;
  }
  params_00[-1].hostApiSpecificStreamInfo = (void *)0x10c8da;
  __assert_fail("stream->streamRepresentation.streamInfo.sampleRate > 0.0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                ,0x8a7,"int CalculatePollTimeout(const PaAlsaStream *, unsigned long)");
}

Assistant:

static PaError PaAlsaStream_Configure( PaAlsaStream *self, const PaStreamParameters *inParams, const PaStreamParameters*
        outParams, double sampleRate, unsigned long framesPerUserBuffer, double* inputLatency, double* outputLatency,
        PaUtilHostBufferSizeMode* hostBufferSizeMode )
{
    PaError result = paNoError;
    double realSr = sampleRate;
    snd_pcm_hw_params_t* hwParamsCapture, * hwParamsPlayback;

    alsa_snd_pcm_hw_params_alloca( &hwParamsCapture );
    alsa_snd_pcm_hw_params_alloca( &hwParamsPlayback );

    if( self->capture.pcm )
        PA_ENSURE( PaAlsaStreamComponent_InitialConfigure( &self->capture, inParams, self->primeBuffers, hwParamsCapture,
                    &realSr ) );
    if( self->playback.pcm )
        PA_ENSURE( PaAlsaStreamComponent_InitialConfigure( &self->playback, outParams, self->primeBuffers, hwParamsPlayback,
                    &realSr ) );

    PA_ENSURE( PaAlsaStream_DetermineFramesPerBuffer( self, realSr, inParams, outParams, framesPerUserBuffer,
                hwParamsCapture, hwParamsPlayback, hostBufferSizeMode ) );

    if( self->capture.pcm )
    {
        assert( self->capture.framesPerPeriod != 0 );
        PA_ENSURE( PaAlsaStreamComponent_FinishConfigure( &self->capture, hwParamsCapture, inParams, self->primeBuffers, realSr,
                    inputLatency ) );
        PA_DEBUG(( "%s: Capture period size: %lu, latency: %f\n", __FUNCTION__, self->capture.framesPerPeriod, *inputLatency ));
    }
    if( self->playback.pcm )
    {
        assert( self->playback.framesPerPeriod != 0 );
        PA_ENSURE( PaAlsaStreamComponent_FinishConfigure( &self->playback, hwParamsPlayback, outParams, self->primeBuffers, realSr,
                    outputLatency ) );
        PA_DEBUG(( "%s: Playback period size: %lu, latency: %f\n", __FUNCTION__, self->playback.framesPerPeriod, *outputLatency ));
    }

    /* Should be exact now */
    self->streamRepresentation.streamInfo.sampleRate = realSr;

    /* this will cause the two streams to automatically start/stop/prepare in sync.
     * We only need to execute these operations on one of the pair.
     * A: We don't want to do this on a blocking stream.
     */
    if( self->callbackMode && self->capture.pcm && self->playback.pcm )
    {
        int err = alsa_snd_pcm_link( self->capture.pcm, self->playback.pcm );
        if( err == 0 )
            self->pcmsSynced = 1;
        else
            PA_DEBUG(( "%s: Unable to sync pcms: %s\n", __FUNCTION__, alsa_snd_strerror( err ) ));
    }

    {
        unsigned long minFramesPerHostBuffer = PA_MIN( self->capture.pcm ? self->capture.framesPerPeriod : ULONG_MAX,
            self->playback.pcm ? self->playback.framesPerPeriod : ULONG_MAX );
        self->pollTimeout = CalculatePollTimeout( self, minFramesPerHostBuffer );    /* Period in msecs, rounded up */

        /* Time before watchdog unthrottles realtime thread == 1/4 of period time in msecs */
        /* self->threading.throttledSleepTime = (unsigned long) (minFramesPerHostBuffer / sampleRate / 4 * 1000); */
    }

    if( self->callbackMode )
    {
        /* If the user expects a certain number of frames per callback we will either have to rely on block adaption
         * (framesPerHostBuffer is not an integer multiple of framesPerPeriod) or we can simply align the number
         * of host buffer frames with what the user specified */
        if( self->framesPerUserBuffer != paFramesPerBufferUnspecified )
        {
            /* self->alignFrames = 1; */

            /* Unless the ratio between number of host and user buffer frames is an integer we will have to rely
             * on block adaption */
        /*
            if( framesPerHostBuffer % framesPerPeriod != 0 || (self->capture.pcm && self->playback.pcm &&
                        self->capture.framesPerPeriod != self->playback.framesPerPeriod) )
                self->useBlockAdaption = 1;
            else
                self->alignFrames = 1;
        */
        }
    }

error:
    return result;
}